

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tn93_shared.cc
# Opt level: O0

void init_genrand(unsigned_long s)

{
  unsigned_long s_local;
  
  mt[0] = s & 0xffffffff;
  for (mti = 1; mti < 0x270; mti = mti + 1) {
    mt[mti] = (mt[mti + -1] ^ mt[mti + -1] >> 0x1e) * 0x6c078965 + (long)mti;
    mt[mti] = mt[mti] & 0xffffffff;
  }
  return;
}

Assistant:

void init_genrand(unsigned long s)
{
  mt[0]= s & 0xffffffffUL;
  for (mti=1; mti<N; mti++) {
    mt[mti] =
    (1812433253UL * (mt[mti-1] ^ (mt[mti-1] >> 30)) + mti);
    /* See Knuth TAOCP Vol2. 3rd Ed. P.106 for multiplier. */
    /* In the previous versions, MSBs of the seed affect   */
    /* only MSBs of the array mt[].                        */
    /* 2002/01/09 modified by Makoto Matsumoto             */
    mt[mti] &= 0xffffffffUL;
    /* for >32 bit machines */
  }
}